

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

string * __thiscall
duckdb::AggregateStateType::GetTypeName_abi_cxx11_
          (string *__return_storage_ptr__,AggregateStateType *this,LogicalType *type)

{
  ExtraTypeInfo *pEVar1;
  const_reference pvVar2;
  ulong __n;
  allocator local_1d1;
  string *local_1d0;
  string local_1c8;
  optional_ptr<duckdb::ExtraTypeInfo,_true> info;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  aggregate_state_t aggr_state;
  string local_50;
  
  info.ptr = *(ExtraTypeInfo **)(this + 8);
  local_1d0 = __return_storage_ptr__;
  if (info.ptr == (ExtraTypeInfo *)0x0) {
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"AGGREGATE_STATE<?>",(allocator *)&aggr_state);
  }
  else {
    pEVar1 = optional_ptr<duckdb::ExtraTypeInfo,_true>::operator->(&info);
    aggregate_state_t::aggregate_state_t(&aggr_state,(aggregate_state_t *)(pEVar1 + 1));
    ::std::operator+(&local_160,"AGGREGATE_STATE<",&aggr_state.function_name);
    ::std::operator+(&local_140,&local_160,"(");
    ::std::__cxx11::string::string((string *)&local_180,", ",&local_1d1);
    local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
    local_1a0._M_string_length = 0;
    local_1a0.field_2._M_local_buf[0] = '\0';
    if (aggr_state.bound_argument_types.
        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        aggr_state.bound_argument_types.
        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pvVar2 = vector<duckdb::LogicalType,_true>::get<true>(&aggr_state.bound_argument_types,0);
      LogicalType::ToString_abi_cxx11_(&local_1c8,pvVar2);
      ::std::__cxx11::string::append((string *)&local_1a0);
      ::std::__cxx11::string::~string((string *)&local_1c8);
    }
    for (__n = 1; __n < (ulong)(((long)aggr_state.bound_argument_types.
                                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                       .
                                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)aggr_state.bound_argument_types.
                                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                      .
                                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                      ._M_impl.super__Vector_impl_data._M_start) / 0x18);
        __n = __n + 1) {
      pvVar2 = vector<duckdb::LogicalType,_true>::get<true>(&aggr_state.bound_argument_types,__n);
      LogicalType::ToString_abi_cxx11_(&local_50,pvVar2);
      ::std::operator+(&local_1c8,&local_180,&local_50);
      ::std::__cxx11::string::append((string *)&local_1a0);
      ::std::__cxx11::string::~string((string *)&local_1c8);
      ::std::__cxx11::string::~string((string *)&local_50);
    }
    ::std::operator+(&local_120,&local_140,&local_1a0);
    ::std::operator+(&local_100,&local_120,")");
    ::std::operator+(&local_e0,&local_100,"::");
    LogicalType::ToString_abi_cxx11_(&local_1c8,&aggr_state.return_type);
    ::std::operator+(&local_c0,&local_e0,&local_1c8);
    ::std::operator+(local_1d0,&local_c0,">");
    ::std::__cxx11::string::~string((string *)&local_c0);
    ::std::__cxx11::string::~string((string *)&local_1c8);
    ::std::__cxx11::string::~string((string *)&local_e0);
    ::std::__cxx11::string::~string((string *)&local_100);
    ::std::__cxx11::string::~string((string *)&local_120);
    ::std::__cxx11::string::~string((string *)&local_1a0);
    ::std::__cxx11::string::~string((string *)&local_180);
    ::std::__cxx11::string::~string((string *)&local_140);
    ::std::__cxx11::string::~string((string *)&local_160);
    aggregate_state_t::~aggregate_state_t(&aggr_state);
  }
  return local_1d0;
}

Assistant:

const string AggregateStateType::GetTypeName(const LogicalType &type) {
	D_ASSERT(type.id() == LogicalTypeId::AGGREGATE_STATE);
	auto info = type.AuxInfo();
	if (!info) {
		return "AGGREGATE_STATE<?>";
	}
	auto aggr_state = info->Cast<AggregateStateTypeInfo>().state_type;
	return "AGGREGATE_STATE<" + aggr_state.function_name + "(" +
	       StringUtil::Join(aggr_state.bound_argument_types, aggr_state.bound_argument_types.size(), ", ",
	                        [](const LogicalType &arg_type) { return arg_type.ToString(); }) +
	       ")" + "::" + aggr_state.return_type.ToString() + ">";
}